

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void compile_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,backtrack_common *parent)

{
  backtrack_common **ppbVar1;
  sljit_u8 sVar2;
  byte bVar3;
  ushort uVar4;
  sljit_compiler *compiler;
  jump_list *pjVar5;
  undefined8 uVar6;
  bool bVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  sljit_s32 sVar11;
  then_trap_backtrack *ptVar12;
  jump_list **ppjVar13;
  sljit_jump *psVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 extraout_RAX;
  PCRE2_SPTR16 pPVar15;
  PCRE2_SPTR16 pPVar16;
  assert_backtrack *backtrack;
  sljit_compiler *psVar17;
  sljit_jump *psVar18;
  sljit_jump *psVar19;
  sljit_jump *jump;
  sljit_jump *psVar20;
  undefined4 extraout_var_02;
  sljit_label *psVar21;
  backtrack_common *pbVar22;
  recurse_entry *prVar23;
  backtrack_common *pbVar24;
  BOOL BVar25;
  long lVar26;
  jump_list **ppjVar27;
  sljit_sw offset;
  sljit_u32 max;
  sljit_u32 max_00;
  int iVar28;
  sljit_compiler *psVar29;
  compiler_common *common_00;
  recurse_entry *prVar30;
  ushort uVar31;
  sljit_u32 sVar32;
  compiler_common *cc_00;
  jump_list **ppjVar33;
  int stacktop;
  sljit_s32 sVar34;
  ulong uVar35;
  undefined1 *srcw;
  ulong srcw_00;
  uint uVar36;
  int iVar37;
  bool bVar38;
  sljit_sw sVar39;
  undefined8 uVar40;
  sljit_compiler *local_150;
  sljit_jump *local_140;
  ulong local_138;
  ulong local_108;
  ushort local_f8;
  BOOL needs_control_head;
  jump_list **local_f0;
  undefined8 local_e8;
  ulong local_e0;
  sljit_compiler *local_d8;
  then_trap_backtrack *local_d0;
  ulong local_c8;
  long local_c0;
  backtrack_common *local_b8;
  compare_context local_b0;
  sljit_sw local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  jump_list **local_68;
  recurse_entry *local_60;
  jump_list **local_58;
  jump_list **local_50;
  jump_list **local_48;
  PCRE2_SPTR16 local_40;
  sljit_label *local_38;
  
  compiler = common->compiler;
  local_d8 = (sljit_compiler *)ccend;
  if ((common->has_then == 0) || (common->then_offsets[(long)cc - (long)common->start >> 1] == '\0')
     ) {
    bVar7 = true;
    local_d0 = (then_trap_backtrack *)0x0;
  }
  else {
    local_d0 = common->then_trap;
    ptVar12 = (then_trap_backtrack *)sljit_alloc_memory(compiler,0x48);
    if (compiler->error == 0) {
      ptVar12->start = 0;
      ptVar12->quit = (jump_list *)0x0;
      (ptVar12->common).cc = (PCRE2_SPTR16)0x0;
      ptVar12->then_trap = (then_trap_backtrack *)0x0;
      (ptVar12->common).top = (backtrack_common *)0x0;
      (ptVar12->common).topbacktracks = (jump_list *)0x0;
      *(undefined8 *)&ptVar12->framesize = 0;
      (ptVar12->common).prev = (backtrack_common *)0x0;
      (ptVar12->common).nextbacktracks = (jump_list *)0x0;
      (ptVar12->common).prev = parent->top;
      parent->top = (backtrack_common *)ptVar12;
      common->then_trap = ptVar12;
      (ptVar12->common).cc = then_trap_opcode;
      ptVar12->start = (long)cc - (long)common->start >> 1;
      uVar9 = get_framesize(common,cc,(PCRE2_SPTR16)local_d8,0,&local_b0.length);
      ptVar12->framesize = uVar9;
      uVar36 = 0;
      if (0 < (int)uVar9) {
        uVar36 = uVar9;
      }
      sljit_emit_op1(compiler,0x20,4,0,0x8e,(long)common->control_head_ptr);
      allocate_stack(common,uVar36 + 3);
      if ((int)uVar9 < 1) {
        sljit_emit_op1(compiler,0x20,0x8e,(long)common->control_head_ptr,0xc,0);
      }
      else {
        sljit_emit_op2(compiler,0x60,0x8e,(long)common->control_head_ptr,0xc,0,0x40,
                       (ulong)uVar36 << 3);
      }
      sljit_emit_op1(compiler,0x20,0x8c,(ulong)(uVar36 * 8 + 0x10),0x40,ptVar12->start);
      sljit_emit_op1(compiler,0x20,0x8c,(long)(int)(uVar36 * 8 + 8),0x40,1);
      iVar10 = 4;
      sljit_emit_op1(compiler,0x20,0x8c,(ulong)(uVar36 << 3),4,0);
      if (-1 < ptVar12->framesize) {
        init_frame(common,cc,(PCRE2_SPTR16)local_d8,ptVar12->framesize + -1,iVar10);
      }
    }
    bVar7 = false;
  }
  local_68 = &common->reset_match;
  local_f0 = &common->accept;
  local_50 = &common->abort;
  local_60 = (recurse_entry *)&common->entries;
  ppjVar13 = &parent->topbacktracks;
  local_58 = &common->anynewline;
  local_48 = &common->wordboundary;
LAB_00137559:
  if (local_d8 <= cc) {
    if (bVar7) {
      return;
    }
    pbVar24 = (backtrack_common *)sljit_alloc_memory(compiler,0x48);
    if (compiler->error != 0) {
      return;
    }
    pbVar24[1].nextbacktracks = (jump_list *)0x0;
    pbVar24[1].top = (backtrack_common *)0x0;
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24[1].prev = (backtrack_common *)0x0;
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24[1].topbacktracks = (jump_list *)0x0;
    pbVar24->prev = parent->top;
    parent->top = pbVar24;
    pbVar24->cc = then_trap_opcode;
    pbVar24[1].prev = &common->then_trap->common;
    common->then_trap = local_d0;
    return;
  }
  uVar31 = (ushort)((sljit_compiler *)cc)->error;
  uVar36 = (uint)uVar31;
  if (0xa2 < uVar31 - 1) {
    return;
  }
  switch((uint)uVar31) {
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x7d:
    psVar17 = (sljit_compiler *)((long)&((sljit_compiler *)cc)->error + 2);
    ppjVar27 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar27 = ppjVar13;
    }
    bVar38 = false;
LAB_001375c0:
    psVar29 = common->compiler;
    switch(uVar36) {
    case 0x17:
      goto switchD_001375e4_caseD_17;
    case 0x18:
switchD_001375e4_caseD_18:
      psVar14 = sljit_emit_cmp(psVar29,2,2,0,0xd,0);
      add_jump(psVar29,ppjVar27,psVar14);
      goto LAB_00139baf;
    case 0x19:
      sljit_emit_op1(psVar29,0x20,4,0,9,0);
      sljit_emit_op2(psVar29,0x365,0,0,0x84,0x58,0x40,2);
      psVar14 = sljit_emit_jump(psVar29,0x101);
      add_jump(psVar29,ppjVar27,psVar14);
      if (common->endonly != 0) goto switchD_001375e4_caseD_18;
      if (!bVar38) {
        local_150 = psVar17;
      }
      bVar38 = true;
      uVar36 = 0x17;
      goto LAB_001375c0;
    case 0x1a:
      psVar14 = sljit_emit_cmp(psVar29,2,2,0,0xd,0);
      sljit_emit_op1(psVar29,0x20,4,0,9,0);
      sljit_emit_op2(psVar29,0x365,0,0,0x84,0x58,0x40,2);
      psVar20 = sljit_emit_jump(psVar29,0x101);
      add_jump(psVar29,ppjVar27,psVar20);
      check_partial(common,0);
      local_140 = sljit_emit_jump(psVar29,0x18);
      psVar21 = sljit_emit_label(psVar29);
      sljit_set_label(psVar14,psVar21);
      if ((common->nltype != 0) || (common->newline < 0x100)) {
        peek_char(common,(sljit_u32)psVar21);
        goto LAB_00138e49;
      }
      sljit_emit_op2(psVar29,0x60,4,0,2,0,0x40,4);
      sljit_emit_op1(psVar29,0x23,1,0,0x82,0);
      if (common->mode == 1) {
        psVar14 = sljit_emit_cmp(psVar29,4,4,0,0xd,0);
        add_jump(psVar29,ppjVar27,psVar14);
      }
      else {
        psVar14 = sljit_emit_cmp(psVar29,5,4,0,0xd,0);
        psVar20 = sljit_emit_cmp(psVar29,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
        add_jump(psVar29,ppjVar27,psVar20);
        check_partial(common,1);
        psVar20 = sljit_emit_jump(psVar29,0x18);
        add_jump(psVar29,ppjVar27,psVar20);
        psVar21 = sljit_emit_label(psVar29);
        sljit_set_label(psVar14,psVar21);
      }
      sljit_emit_op1(psVar29,0x23,4,0,0x82,2);
      psVar14 = sljit_emit_cmp(psVar29,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
      add_jump(psVar29,ppjVar27,psVar14);
      bVar3 = (byte)common->newline;
LAB_00139caf:
      psVar14 = sljit_emit_cmp(psVar29,1,4,0,0x40,(ulong)bVar3);
      add_jump(psVar29,ppjVar27,psVar14);
      break;
    case 0x1b:
      sljit_emit_op1(psVar29,0x20,4,0,9,0);
      sljit_emit_op1(psVar29,0x20,1,0,0x84,0x10);
      psVar14 = sljit_emit_cmp(psVar29,4,2,0,1,0);
      add_jump(psVar29,ppjVar27,psVar14);
      sljit_emit_op2(psVar29,0x365,0,0,0x84,0x58,0x40,1);
      uVar36 = 0x101;
LAB_00138a25:
      psVar14 = sljit_emit_jump(psVar29,uVar36);
      goto LAB_00138d6a;
    case 0x1c:
      sljit_emit_op1(psVar29,0x20,4,0,9,0);
      sljit_emit_op1(psVar29,0x20,1,0,0x84,0x10);
      psVar14 = sljit_emit_cmp(psVar29,4,2,0,1,0);
      BVar25 = 0x40;
      sljit_emit_op2(psVar29,0x365,0,0,0x84,0x58,0x40,1);
      psVar20 = sljit_emit_jump(psVar29,0x101);
      add_jump(psVar29,ppjVar27,psVar20);
      local_140 = sljit_emit_jump(psVar29,0x18);
      psVar21 = sljit_emit_label(psVar29);
      sljit_set_label(psVar14,psVar21);
      sVar32 = (sljit_u32)psVar21;
      if (common->alt_circumflex == 0) {
        BVar25 = 0;
        psVar14 = sljit_emit_cmp(psVar29,3,2,0,0xd,0);
        ppjVar33 = ppjVar27;
        add_jump(psVar29,ppjVar27,psVar14);
        sVar32 = (sljit_u32)ppjVar33;
      }
      if ((common->nltype == 0) && (0xff < common->newline)) {
        sljit_emit_op2(psVar29,0x62,4,0,2,0,0x40,4);
        psVar14 = sljit_emit_cmp(psVar29,2,4,0,1,0);
        add_jump(psVar29,ppjVar27,psVar14);
        sljit_emit_op1(psVar29,0x23,1,0,0x82,-4);
        sljit_emit_op1(psVar29,0x23,4,0,0x82,-2);
        psVar14 = sljit_emit_cmp(psVar29,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
        add_jump(psVar29,ppjVar27,psVar14);
        bVar3 = (byte)common->newline;
        goto LAB_00139caf;
      }
      skip_char_back(common);
      read_char_range(common,sVar32,max,BVar25);
LAB_00138e49:
      check_newlinechar(common,common->nltype,ppjVar27,0);
      break;
    default:
      if (uVar36 - 4 < 2) {
        psVar14 = sljit_emit_jump(psVar29,0x19);
        add_jump(psVar29,local_48,psVar14);
        uVar36 = (uint)((short)uVar36 == 4);
        goto LAB_00138a25;
      }
      if (uVar36 == 0x7d) {
        uVar31 = (ushort)psVar17->error;
        if (uVar31 != 0) {
          sljit_emit_op1(psVar29,0x20,1,0,9,0);
          sljit_emit_op1(psVar29,0x20,1,0,0x81,0x10);
          sljit_emit_op2(psVar29,0x62,2,0,2,0,0x40,(ulong)((uint)uVar31 * 2));
          psVar14 = sljit_emit_cmp(psVar29,2,2,0,1,0);
          add_jump(psVar29,ppjVar27,psVar14);
          check_start_used_ptr(common);
        }
        psVar17 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
      }
      else {
        if (uVar36 == 2) {
          sljit_emit_op1(psVar29,0x20,1,0,9,0);
          sVar39 = 8;
        }
        else {
          if (uVar36 != 1) goto LAB_00139bb6;
          sljit_emit_op1(psVar29,0x20,1,0,9,0);
          sVar39 = 0x10;
        }
        sljit_emit_op1(psVar29,0x20,1,0,0x81,sVar39);
        psVar14 = sljit_emit_cmp(psVar29,1,2,0,1,0);
LAB_00138d6a:
        add_jump(psVar29,ppjVar27,psVar14);
      }
      goto LAB_00139bb6;
    }
    psVar21 = sljit_emit_label(psVar29);
    sljit_set_label(local_140,psVar21);
    goto LAB_00139bb6;
  case 3:
    pbVar24 = (backtrack_common *)sljit_alloc_memory(compiler,0x28);
    if (compiler->error != 0) {
      return;
    }
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    sljit_emit_op1(compiler,0x20,4,0,0x8e,(long)common->ovector_start);
    allocate_stack(common,1);
    sljit_emit_op1(compiler,0x20,0x8e,(long)common->ovector_start,2,0);
    sljit_emit_op1(compiler,0x20,0x8c,0,4,0);
    goto LAB_001395ce;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x1f:
  case 0x20:
    goto switchD_0013758c_caseD_6;
  case 0x1d:
  case 0x1e:
    if (common->mode != 1) goto switchD_0013758c_caseD_6;
    ppjVar27 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar27 = ppjVar13;
    }
    psVar17 = common->compiler;
    uVar36 = 0;
    psVar29 = (sljit_compiler *)cc;
    while (psVar29 < local_d8) {
      sVar8 = (short)psVar29->error;
      bVar38 = true;
      if (sVar8 == 0x1d) {
LAB_00137998:
        uVar9 = 1;
      }
      else if (sVar8 == 0x1e) {
        uVar4 = *(ushort *)((long)&psVar29->error + 2);
        if (0xff < (ulong)uVar4) goto LAB_00137998;
        uVar9 = 1;
        if (uVar4 != common->fcc[uVar4]) {
          uVar9 = char_get_othercase_bit(common,(PCRE2_SPTR16)((long)&psVar29->error + 2));
          bVar38 = uVar9 != 0;
          uVar9 = (uint)bVar38;
        }
      }
      else {
        bVar38 = false;
        uVar9 = 0;
      }
      uVar36 = uVar36 + uVar9 * 2;
      if ((!bVar38) ||
         (psVar29 = (sljit_compiler *)((long)&psVar29->error + (ulong)(uVar9 * 2) + 2),
         0x80 < uVar36)) break;
    }
    local_b0.length = uVar36;
    if ((int)uVar36 < 1) {
      psVar17 = (sljit_compiler *)
                compile_char1_matchingpath
                          (common,uVar31,(PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + 2),
                           ppjVar27,1);
    }
    else {
      sljit_emit_op2(psVar17,0x60,2,0,2,0,0x40,(ulong)uVar36);
      psVar14 = sljit_emit_cmp(psVar17,4,2,0,0xd,0);
      add_jump(psVar17,ppjVar27,psVar14);
      local_b0.sourcereg = -1;
      local_b0.ucharptr = 0;
      do {
        cc = byte_sequence_compare
                       (common,(uint)((short)((sljit_compiler *)cc)->error == 0x1e),
                        (PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + 2),&local_b0,ppjVar27)
        ;
        psVar17 = (sljit_compiler *)cc;
      } while (0 < local_b0.length);
    }
    break;
  default:
switchD_0013758c_caseD_21:
    psVar17 = (sljit_compiler *)compile_iterator_matchingpath(common,cc,parent);
    break;
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
    goto switchD_0013758c_caseD_62;
  case 0x6e:
  case 0x6f:
    if ((ushort)(*(short *)((long)&((sljit_compiler *)cc)->last_label + 2) - 0x62U) < 0xc)
    goto switchD_0013758c_caseD_21;
    goto switchD_0013758c_caseD_6;
  case 0x70:
    if ((ushort)(*(short *)((long)&((sljit_compiler *)cc)->error +
                           (ulong)*(ushort *)((long)&((sljit_compiler *)cc)->error + 2) * 2) - 0x62U
                ) < 0xc) goto switchD_0013758c_caseD_21;
    ppjVar27 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar27 = ppjVar13;
    }
    uVar31 = 0x70;
    goto LAB_00137a76;
  case 0x71:
  case 0x72:
    if ((ushort)((short)((sljit_compiler *)cc)->options - 0x62U) < 0xc) goto LAB_00137ac6;
    psVar17 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
    ppjVar27 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar27 = ppjVar13;
    }
LAB_00138502:
    compile_ref_matchingpath(common,cc,ppjVar27,1,0);
    break;
  case 0x73:
  case 0x74:
    if (0xb < (ushort)(*(short *)((long)&((sljit_compiler *)cc)->options + 2) - 0x62U)) {
      psVar17 = (sljit_compiler *)((long)&((sljit_compiler *)cc)->options + 2);
      ppjVar27 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar27 = ppjVar13;
      }
      compile_dnref_search(common,cc,ppjVar27);
      ppjVar27 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar27 = ppjVar13;
      }
      goto LAB_00138502;
    }
LAB_00137ac6:
    psVar17 = (sljit_compiler *)compile_ref_iterator_matchingpath(common,cc,parent);
    break;
  case 0x75:
    local_150 = common->compiler;
    prVar23 = common->entries;
    uVar31 = *(ushort *)((long)&((sljit_compiler *)cc)->error + 2);
    pbVar24 = (backtrack_common *)sljit_alloc_memory(local_150,0x40);
    if (local_150->error == 0) {
      pbVar24[1].nextbacktracks = (jump_list *)0x0;
      pbVar24[1].top = (backtrack_common *)0x0;
      pbVar24->cc = (PCRE2_SPTR16)0x0;
      pbVar24[1].prev = (backtrack_common *)0x0;
      pbVar24->top = (backtrack_common *)0x0;
      pbVar24->topbacktracks = (jump_list *)0x0;
      pbVar24->prev = (backtrack_common *)0x0;
      pbVar24->nextbacktracks = (jump_list *)0x0;
      pbVar24->prev = parent->top;
      pbVar24->cc = cc;
      parent->top = pbVar24;
      common_00 = (compiler_common *)((ulong)((uint)uVar31 + (uint)uVar31) + (long)common->start);
      cc_00 = common_00;
      iVar10 = get_framesize(common,(PCRE2_SPTR16)common_00,(PCRE2_SPTR16)0x0,1,&local_b0.length);
      if (iVar10 == -2) {
        pPVar15 = next_opcode(common_00,(PCRE2_SPTR16)cc_00);
        pPVar16 = bracketend((PCRE2_SPTR16)common_00);
        compile_matchingpath(common,pPVar15,pPVar16 + -2,pbVar24);
        *(undefined4 *)&pbVar24[1].top = 1;
        psVar17 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
      }
      else {
        prVar30 = (recurse_entry *)0x0;
        for (; prVar23 != (recurse_entry *)0x0; prVar23 = prVar23->next) {
          if (prVar23->start == (ulong)uVar31) {
            psVar21 = prVar23->entry_label;
            pbVar24[1].nextbacktracks = (jump_list *)prVar23;
            if (psVar21 == (sljit_label *)0x0) goto LAB_001399f6;
            psVar14 = sljit_emit_jump(local_150,0x19);
            sljit_set_label(psVar14,prVar23->entry_label);
            goto LAB_00139a13;
          }
          prVar30 = prVar23;
        }
        prVar23 = (recurse_entry *)sljit_alloc_memory(local_150,0x30);
        if (local_150->error == 0) {
          prVar23->backtrack_calls = (jump_list *)0x0;
          prVar23->backtrack_label = (sljit_label *)0x0;
          ((anon_union_8_2_cb96b71c_for_u *)&prVar23->entry_calls)->target = 0;
          prVar23->next = (recurse_entry *)0x0;
          prVar23->entry_label = (sljit_label *)0x0;
          prVar23->start = (ulong)uVar31;
          if (prVar30 == (recurse_entry *)0x0) {
            prVar30 = local_60;
          }
          prVar30->next = prVar23;
          pbVar24[1].nextbacktracks = (jump_list *)prVar23;
LAB_001399f6:
          psVar14 = sljit_emit_jump(local_150,0x19);
          add_jump(local_150,
                   (jump_list **)&((anon_union_8_2_cb96b71c_for_u *)&prVar23->entry_calls)->label,
                   psVar14);
LAB_00139a13:
          psVar14 = sljit_emit_cmp(local_150,0,1,0,0x40,0);
          add_jump(local_150,&pbVar24->topbacktracks,psVar14);
          pbVar22 = (backtrack_common *)sljit_emit_label(local_150);
          pbVar24[1].prev = pbVar22;
          psVar17 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
        }
        else {
LAB_00139cce:
          psVar17 = (sljit_compiler *)0x0;
        }
      }
    }
    else {
      psVar17 = (sljit_compiler *)0x0;
    }
    break;
  case 0x76:
  case 0x77:
    if (uVar31 == 0x76) {
      local_150 = (sljit_compiler *)0x4;
    }
    else {
      local_150 = (sljit_compiler *)(ulong)*(ushort *)((long)&((sljit_compiler *)cc)->options + 2);
    }
    psVar17 = common->compiler;
    uVar31 = common->re->top_bracket;
    pbVar24 = (backtrack_common *)sljit_alloc_memory(psVar17,0x28);
    if (psVar17->error != 0) {
      return;
    }
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    uVar36 = (uint)uVar31 * 0x10 + 0x87 >> 3;
    allocate_stack(common,uVar36);
    sljit_emit_op1(psVar17,0x20,4,0,0x8e,(long)common->capture_last_ptr);
    sljit_emit_op1(psVar17,0x20,1,0,9,0);
    uVar35 = 0;
    if ((short)((sljit_compiler *)cc)->error == 0x76) {
      uVar35 = (ulong)*(ushort *)((long)&((sljit_compiler *)cc)->options + 2);
    }
    sljit_emit_op1(psVar17,0x25,0x8c,4,0x40,uVar35);
    sljit_emit_op1(psVar17,0x25,0x8c,0xc,4,0);
    sljit_emit_op1(psVar17,0x25,0x8c,8,0x40,(ulong)common->re->top_bracket + 1);
    sljit_emit_op1(psVar17,0x20,0x8c,0x10,2,0);
    if (common->mark_ptr != 0) {
      sljit_emit_op1(psVar17,0x20,4,0,0x81,0x30);
    }
    sljit_emit_op1(psVar17,0x20,0x8c,0x40,0x40,
                   (ulong)*(ushort *)((long)&((sljit_compiler *)cc)->error + 2));
    sljit_emit_op1(psVar17,0x20,0x8c,0x48,0x40,(ulong)(ushort)((sljit_compiler *)cc)->options);
    if ((short)((sljit_compiler *)cc)->error == 0x76) {
      srcw = (undefined1 *)0x0;
      uVar35 = 0;
      local_138 = 0;
    }
    else {
      srcw = (undefined1 *)((long)&((sljit_compiler *)cc)->labels + 4);
      uVar35 = (ulong)((int)local_150 - 7);
      local_138 = (ulong)*(ushort *)&((sljit_compiler *)cc)->labels;
    }
    sljit_emit_op1(psVar17,0x20,0x8c,0x60,0x40,(sljit_sw)srcw);
    sljit_emit_op1(psVar17,0x20,0x8c,0x58,0x40,uVar35);
    sljit_emit_op1(psVar17,0x20,0x8c,0x50,0x40,local_138);
    sVar11 = 4;
    if (common->mark_ptr == 0) {
      sVar11 = 0x40;
    }
    sljit_emit_op1(psVar17,0x20,0x8c,0x18,sVar11,0);
    sljit_emit_op1(psVar17,0x20,0x8e,0,2,0);
    offset = 0;
    sVar39 = 0xc;
    sljit_emit_op1(psVar17,0x20,2,0,0xc,0);
    sljit_get_local_base(psVar17,3,(long)common->ovector_start,offset);
    sljit_emit_icall(psVar17,0x1113,0x1449c1,(sljit_s32)offset,sVar39);
    sljit_emit_op1(psVar17,0x20,2,0,0x8e,0);
    free_stack(common,uVar36);
    sljit_emit_op2(psVar17,0x2362,0,0,1,0,0x40,0);
    psVar14 = sljit_emit_jump(psVar17,0x108);
    add_jump(psVar17,&pbVar24->topbacktracks,psVar14);
    psVar21 = common->abort_label;
    psVar14 = sljit_emit_jump(psVar17,0x101);
    if (psVar21 == (sljit_label *)0x0) {
      add_jump(psVar17,local_50,psVar14);
    }
    else {
      sljit_set_label(psVar14,common->abort_label);
    }
    psVar17 = (sljit_compiler *)((long)&((sljit_compiler *)cc)->error + (long)local_150 * 2);
    break;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_0013758c_caseD_7e;
  case 0x82:
  case 0x83:
  case 0x85:
  case 0x87:
  case 0x88:
  case 0x8a:
  case 0x8c:
switchD_0013758c_caseD_82:
    psVar17 = (sljit_compiler *)compile_bracket_matchingpath(common,cc,parent);
    break;
  case 0x84:
  case 0x86:
  case 0x89:
  case 0x8b:
  case 0x95:
    psVar17 = common->compiler;
    local_b0.length = 0;
    local_b0.sourcereg = 0;
    pbVar24 = (backtrack_common *)sljit_alloc_memory(psVar17,0x38);
    if (psVar17->error == 0) {
      pbVar24->cc = (PCRE2_SPTR16)0x0;
      pbVar24[1].prev = (backtrack_common *)0x0;
      pbVar24->top = (backtrack_common *)0x0;
      pbVar24->topbacktracks = (jump_list *)0x0;
      pbVar24->prev = (backtrack_common *)0x0;
      pbVar24->nextbacktracks = (jump_list *)0x0;
      pbVar24[1].nextbacktracks = (jump_list *)0x0;
      pbVar24->prev = parent->top;
      pbVar24->cc = cc;
      parent->top = pbVar24;
      sVar8 = (short)((sljit_compiler *)cc)->error;
      pPVar16 = (PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + (ulong)(sVar8 == 0x95) * 2);
      uVar31 = *pPVar16;
      local_c8 = (ulong)uVar31;
      iVar10 = *(int *)((long)common->private_data_ptrs + ((long)pPVar16 - (long)common->start) * 2)
      ;
      lVar26 = (long)iVar10;
      *(int *)&pbVar24[1].prev = iVar10;
      pPVar15 = (PCRE2_SPTR16)0x0;
      local_138 = 0;
      uVar35 = 0;
      switch(uVar31) {
      case 0x84:
      case 0x89:
        pPVar15 = pPVar16 + 2;
      default:
        local_138 = 0;
        uVar35 = 0;
        break;
      case 0x85:
      case 0x87:
      case 0x88:
      case 0x8a:
        break;
      case 0x86:
      case 0x8b:
        uVar35 = (ulong)((uint)pPVar16[2] * 2);
        pPVar15 = pPVar16 + 3;
        local_138 = (ulong)(int)((uint)pPVar16[2] * 8 + common->cbra_ptr);
      }
      local_b8 = pbVar24;
      iVar10 = get_framesize(common,pPVar16,(PCRE2_SPTR16)0x0,0,&needs_control_head);
      BVar25 = needs_control_head;
      local_150 = (sljit_compiler *)CONCAT44(extraout_var,iVar10);
      *(int *)((long)&local_b8[1].prev + 4) = iVar10;
      iVar37 = (int)uVar35;
      if (iVar10 < 0) {
        iVar28 = 1;
        if (iVar37 != 0) {
          iVar28 = 3 - (uint)(common->capture_last_ptr == 0);
        }
        bVar38 = needs_control_head != 0;
        uVar36 = (uint)(sVar8 != 0x95) + iVar28 + (uint)bVar38;
        local_108 = (ulong)uVar36;
        *(uint *)&local_b8[1].nextbacktracks = uVar36;
        allocate_stack(common,uVar36);
        if (iVar10 == -1) {
          sljit_emit_op1(psVar17,0x20,0x8e,lVar26,0xc,0);
        }
        if (iVar37 == 0) {
          if (BVar25 != 0) {
            sljit_emit_op1(psVar17,0x20,4,0,0x8e,(long)common->control_head_ptr);
          }
          sljit_emit_op1(psVar17,0x20,0x8c,0,2,0);
          uVar40 = 1;
          uVar6 = uVar40;
        }
        else {
          sljit_emit_op1(psVar17,0x20,1,0,0x8e,(long)common->ovector_start + uVar35 * 8);
          sljit_emit_op1(psVar17,0x20,4,0,0x8e,(long)common->ovector_start + uVar35 * 8 + 8);
          sljit_emit_op1(psVar17,0x20,0x8c,0,1,0);
          if ((long)common->capture_last_ptr != 0) {
            sljit_emit_op1(psVar17,0x20,1,0,0x8e,(long)common->capture_last_ptr);
          }
          sVar11 = sljit_emit_op1(psVar17,0x20,0x8c,8,4,0);
          uVar40 = CONCAT44(extraout_var_00,sVar11);
          if (BVar25 != 0) {
            sVar11 = sljit_emit_op1(psVar17,0x20,4,0,0x8e,(long)common->control_head_ptr);
            uVar40 = CONCAT44(extraout_var_01,sVar11);
          }
          uVar6 = 2;
          if (common->capture_last_ptr != 0) {
            sljit_emit_op1(psVar17,0x20,0x8c,0x10,1,0);
            uVar40 = 3;
            uVar6 = uVar40;
          }
        }
        iVar28 = (int)uVar6;
        if (sVar8 != 0x95) {
          sVar11 = sljit_emit_op1(psVar17,0x20,0x8c,(ulong)(((uint)bVar38 + iVar28) * 8),0x40,1);
          uVar40 = CONCAT44(extraout_var_02,sVar11);
        }
        if (BVar25 == 0) {
          local_e8 = CONCAT71((int7)((ulong)uVar40 >> 8),1);
        }
        else {
          local_e8 = 0;
          sljit_emit_op1(psVar17,0x20,0x8c,(ulong)(uint)(iVar28 * 8),4,0);
        }
      }
      else {
        uVar36 = (uint)(sVar8 != 0x95) + iVar10 + (uint)(iVar37 == 0) + 1 +
                 (uint)(needs_control_head != 0);
        local_108 = (ulong)uVar36;
        *(uint *)&local_b8[1].nextbacktracks = uVar36;
        allocate_stack(common,uVar36);
        sljit_emit_op1(psVar17,0x20,1,0,0x8e,lVar26);
        if (BVar25 != 0) {
          sljit_emit_op1(psVar17,0x20,4,0,0x8e,(long)common->control_head_ptr);
        }
        sljit_emit_op2(psVar17,0x60,0x8e,lVar26,0xc,0,0x40,local_108 << 3);
        if (sVar8 != 0x95) {
          sljit_emit_op1(psVar17,0x20,0x8c,0,0x40,1);
        }
        uVar9 = (uint)(sVar8 != 0x95);
        if (BVar25 != 0) {
          sljit_emit_op1(psVar17,0x20,0x8c,(ulong)(uVar9 * 8),4,0);
          uVar9 = uVar9 + 1;
        }
        if (iVar37 == 0) {
          sljit_emit_op1(psVar17,0x20,0x8c,(ulong)(uVar9 * 8),2,0);
          uVar9 = uVar9 + 1;
          iVar28 = -2;
        }
        else {
          iVar28 = -1;
        }
        stacktop = 1;
        sljit_emit_op1(psVar17,0x20,0x8c,(ulong)(uVar9 * 8),1,0);
        init_frame(common,pPVar16,(PCRE2_SPTR16)0x0,uVar36 - 1,stacktop);
        iVar28 = iVar28 + uVar9;
        local_e8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),BVar25 == 0);
      }
      if (iVar37 != 0) {
        sljit_emit_op1(psVar17,0x20,0x8e,local_138,2,0);
      }
      local_38 = sljit_emit_label(psVar17);
      pbVar24 = local_b8;
      ppbVar1 = &local_b8->top;
      ppjVar27 = &local_b8->topbacktracks;
      local_70 = local_108 << 3;
      local_78 = (ulong)(iVar37 * 8 + 8);
      local_90 = uVar35 >> 1;
      local_80 = (ulong)(uint)(iVar37 * 8);
      local_c0 = (long)(iVar10 * -8 + -0x10);
      local_88 = (long)(iVar28 << 3);
      local_f8 = (ushort)local_c8 & 0xfffd;
      local_98 = (sljit_sw)((int)local_108 * 8 + -8);
      bVar38 = *pPVar16 == 0x7c;
      local_e0 = uVar35;
      while (!bVar38) {
        *ppbVar1 = (backtrack_common *)0x0;
        pbVar24->topbacktracks = (jump_list *)0x0;
        pPVar16 = pPVar16 + pPVar16[1];
        compile_matchingpath(common,pPVar15,pPVar16,local_b8);
        if (psVar17->error != 0) goto LAB_00139cce;
        if (iVar10 < 0) {
          if (iVar10 == -1) {
            sljit_emit_op1(psVar17,0x20,0xc,0,0x8e,lVar26);
          }
          if ((int)uVar35 == 0) {
            if ((short)local_c8 == 0x89) {
              sljit_emit_op1(psVar17,0x20,1,0,0x8c,0);
            }
            sljit_emit_op1(psVar17,0x20,0x8c,0,2,0);
          }
          else {
            sljit_emit_op1(psVar17,0x20,1,0,0x8e,local_138);
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->ovector_start + local_78,2,0);
            sljit_emit_op1(psVar17,0x20,0x8e,local_138,2,0);
            if ((long)common->capture_last_ptr != 0) {
              sljit_emit_op1(psVar17,0x20,0x8e,(long)common->capture_last_ptr,0x40,local_90);
            }
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->ovector_start + local_80,1,0);
            uVar35 = local_e0;
          }
          if ((char)local_e8 == '\0') {
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->control_head_ptr,0x8c,local_88);
          }
          if (local_f8 == 0x89) {
            psVar14 = sljit_emit_cmp(psVar17,0,1,0,2,0);
            add_jump(psVar17,(jump_list **)&local_b0,psVar14);
          }
          sVar39 = local_98;
          if (sVar8 != 0x95) goto LAB_001393e5;
        }
        else {
          if ((int)uVar35 == 0) {
            sljit_emit_op1(psVar17,0x20,4,0,0x8e,lVar26);
            sljit_emit_op2(psVar17,0x62,0xc,0,4,0,0x40,local_70);
            if ((short)local_c8 == 0x89) {
              sljit_emit_op1(psVar17,0x20,1,0,0x84,local_c0);
            }
            sljit_emit_op1(psVar17,0x20,0x84,local_c0,2,0);
          }
          else {
            local_40 = pPVar16;
            sljit_emit_op2(psVar17,0x62,0xc,0,0x8e,lVar26,0x40,local_70);
            sljit_emit_op1(psVar17,0x20,1,0,0x8e,local_138);
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->ovector_start + local_78,2,0);
            sljit_emit_op1(psVar17,0x20,0x8e,local_138,2,0);
            if ((long)common->capture_last_ptr != 0) {
              sljit_emit_op1(psVar17,0x20,0x8e,(long)common->capture_last_ptr,0x40,local_90);
            }
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->ovector_start + local_80,1,0);
            pPVar16 = local_40;
          }
          uVar35 = local_e0;
          if ((char)local_e8 == '\0') {
            sljit_emit_op1(psVar17,0x20,0x8e,(long)common->control_head_ptr,0x8c,local_88);
          }
          if (local_f8 == 0x89) {
            psVar14 = sljit_emit_cmp(psVar17,0,1,0,2,0);
            add_jump(psVar17,(jump_list **)&local_b0,psVar14);
          }
          if (sVar8 != 0x95) {
            sVar39 = 0;
LAB_001393e5:
            sljit_emit_op1(psVar17,0x20,0x8c,sVar39,0x40,0);
          }
        }
        psVar14 = sljit_emit_jump(psVar17,0x18);
        sljit_set_label(psVar14,local_38);
        flush_stubs(common);
        compile_backtrackingpath(common,*ppbVar1);
        if (psVar17->error != 0) goto LAB_00139cc7;
        pjVar5 = *ppjVar27;
        psVar21 = sljit_emit_label(psVar17);
        set_jumps(pjVar5,psVar21);
        if (iVar10 < 0) {
          if ((int)uVar35 == 0) {
            sVar11 = 0x8c;
            srcw_00 = 0;
          }
          else {
            sVar11 = 0x8e;
            srcw_00 = local_138;
          }
LAB_0013950b:
          sljit_emit_op1(psVar17,0x20,2,0,sVar11,srcw_00);
        }
        else {
          if ((int)uVar35 == 0) {
            sljit_emit_op1(psVar17,0x20,4,0,0x8e,lVar26);
            sVar11 = 0x84;
            srcw_00 = local_c0;
            uVar35 = local_e0;
            goto LAB_0013950b;
          }
          if (*pPVar16 == 0x7c) {
            sljit_emit_op1(psVar17,0x20,4,0,0x8e,lVar26);
          }
          sljit_emit_op1(psVar17,0x20,2,0,0x8e,local_138);
        }
        if (*pPVar16 == 0x7c) break;
        pPVar15 = pPVar16 + 2;
        bVar38 = false;
      }
      *ppjVar27 = (jump_list *)0x0;
      if (sVar8 != 0x95) {
        if (iVar10 < 0) {
          sVar11 = 0x8c;
          lVar26 = local_98;
        }
        else {
          sVar11 = 0x84;
          lVar26 = (long)((int)local_108 * -8);
        }
        psVar14 = sljit_emit_cmp(psVar17,1,sVar11,lVar26,0x40,0);
        add_jump(psVar17,ppjVar27,psVar14);
      }
      pjVar5 = (jump_list *)CONCAT44(local_b0.sourcereg,local_b0.length);
      psVar21 = sljit_emit_label(psVar17);
      set_jumps(pjVar5,psVar21);
      count_match(common);
      psVar17 = (sljit_compiler *)(pPVar16 + 2);
    }
    else {
LAB_00139cc7:
      psVar17 = (sljit_compiler *)0x0;
    }
    break;
  case 0x93:
    if (0x81 < *(ushort *)((long)&((sljit_compiler *)cc)->error + 2))
    goto switchD_0013758c_caseD_82;
    goto switchD_0013758c_caseD_7e;
  case 0x94:
    pbVar24 = (backtrack_common *)sljit_alloc_memory(compiler,0x30);
    if (compiler->error != 0) {
      return;
    }
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24[1].prev = (backtrack_common *)0x0;
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    psVar17 = (sljit_compiler *)bracketend((PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + 2))
    ;
    if (*(short *)&psVar17[-1].field_0x84 == 0x7b) {
      allocate_stack(common,2);
      sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
      sVar39 = 8;
    }
    else {
      allocate_stack(common,1);
      sVar39 = 0;
    }
    sljit_emit_op1(compiler,0x20,0x8c,sVar39,2,0);
    pbVar22 = (backtrack_common *)sljit_emit_label(compiler);
    pbVar24[1].prev = pbVar22;
    count_match(common);
    break;
  case 0x96:
    pbVar24 = (backtrack_common *)sljit_alloc_memory(compiler,0x28);
    if (compiler->error != 0) {
      return;
    }
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    sljit_emit_op1(compiler,0x20,4,0,0x8e,(long)common->mark_ptr);
    allocate_stack(common,(uint)(common->has_skip_arg != 0) * 4 + 1);
    sljit_emit_op1(compiler,0x20,1,0,9,0);
    sljit_emit_op1(compiler,0x20,0x8c,(ulong)(common->has_skip_arg != 0) << 5,4,0);
    local_150 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
    sljit_emit_op1(compiler,0x20,4,0,0x40,(sljit_sw)local_150);
    sljit_emit_op1(compiler,0x20,0x8e,(long)common->mark_ptr,4,0);
    sljit_emit_op1(compiler,0x20,0x81,0x30,4,0);
    if (common->has_skip_arg != 0) {
      sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->control_head_ptr);
      sljit_emit_op1(compiler,0x20,0x8e,(long)common->control_head_ptr,0xc,0);
      sljit_emit_op1(compiler,0x20,0x8c,8,0x40,0);
      sljit_emit_op1(compiler,0x20,0x8c,0x10,0x40,(sljit_sw)local_150);
      sljit_emit_op1(compiler,0x20,0x8c,0x18,2,0);
      sljit_emit_op1(compiler,0x20,0x8c,0,1,0);
    }
    psVar17 = (sljit_compiler *)
              ((long)&((sljit_compiler *)cc)->options +
              (ulong)*(ushort *)((long)&((sljit_compiler *)cc)->error + 2) * 2 + 2);
    break;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
    psVar17 = (sljit_compiler *)((long)&((sljit_compiler *)cc)->error + 2);
    uVar36 = uVar31 - 0x98;
    if ((uVar36 < 7) && ((0x55U >> (uVar36 & 0x1f) & 1) != 0)) {
      psVar17 = (sljit_compiler *)
                ((long)&((sljit_compiler *)cc)->options + (ulong)(ushort)psVar17->error * 2 + 2);
    }
    psVar29 = common->compiler;
    pbVar24 = (backtrack_common *)sljit_alloc_memory(psVar29,0x28);
    if (psVar29->error != 0) {
      return;
    }
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    switch(uVar36) {
    case 0:
    case 4:
    case 6:
      sljit_emit_op1(psVar29,0x20,1,0,9,0);
      sljit_emit_op1(psVar29,0x20,4,0,0x40,(sljit_sw)&((sljit_compiler *)cc)->options);
      sljit_emit_op1(psVar29,0x20,0x8e,(long)common->mark_ptr,4,0);
      sVar34 = 0x81;
      sVar39 = 0x30;
      sVar11 = 4;
      break;
    case 1:
      allocate_stack(common,1);
      sVar34 = 0x8c;
      sVar39 = 0;
      sVar11 = 2;
      break;
    default:
      goto switchD_001376e0_caseD_2;
    }
    sljit_emit_op1(psVar29,0x20,sVar34,sVar39,sVar11,0);
    break;
  case 0x9f:
  case 0xa0:
  case 0xa1:
    psVar17 = common->compiler;
    pbVar24 = (backtrack_common *)sljit_alloc_memory(psVar17,0x28);
    if (psVar17->error != 0) {
      return;
    }
    pbVar24->cc = (PCRE2_SPTR16)0x0;
    pbVar24->top = (backtrack_common *)0x0;
    pbVar24->topbacktracks = (jump_list *)0x0;
    pbVar24->prev = (backtrack_common *)0x0;
    pbVar24->nextbacktracks = (jump_list *)0x0;
    pbVar24->prev = parent->top;
    pbVar24->cc = cc;
    parent->top = pbVar24;
    sVar8 = (short)((sljit_compiler *)cc)->error;
    if (sVar8 == 0xa0) {
      if (common->currententry == (recurse_entry *)0x0) {
        if ((common->re->overall_options & 0x20000000) != 0) {
          psVar14 = sljit_emit_cmp(psVar17,1,2,0,0xd,0);
          add_jump(psVar17,local_68,psVar14);
          sVar8 = (short)((sljit_compiler *)cc)->error;
          goto LAB_00138765;
        }
LAB_00138775:
        if (common->might_be_empty != 0) {
          psVar21 = common->accept_label;
          psVar14 = sljit_emit_cmp(psVar17,1,2,0,0x8e,(long)common->ovector_start);
          if (psVar21 == (sljit_label *)0x0) {
            add_jump(psVar17,local_f0,psVar14);
          }
          else {
            sljit_set_label(psVar14,common->accept_label);
          }
          sljit_emit_op1(psVar17,0x20,1,0,9,0);
          sljit_emit_op1(psVar17,0x25,4,0,0x81,0x58);
          sljit_emit_op2(psVar17,0x265,0,0,4,0,0x40,4);
          psVar14 = sljit_emit_jump(psVar17,1);
          add_jump(psVar17,&pbVar24->topbacktracks,psVar14);
          sljit_emit_op2(psVar17,0x265,0,0,4,0,0x40,8);
          psVar21 = common->accept_label;
          psVar14 = sljit_emit_jump(psVar17,0);
          if (psVar21 == (sljit_label *)0x0) {
            add_jump(psVar17,local_f0,psVar14);
          }
          else {
            sljit_set_label(psVar14,common->accept_label);
          }
          sljit_emit_op1(psVar17,0x20,4,0,0x81,8);
          psVar21 = common->accept_label;
          psVar14 = sljit_emit_cmp(psVar17,1,4,0,2,0);
          if (psVar21 == (sljit_label *)0x0) {
            add_jump(psVar17,local_f0,psVar14);
          }
          else {
            sljit_set_label(psVar14,common->accept_label);
          }
          goto LAB_001378ce;
        }
      }
LAB_001387bd:
      psVar21 = common->accept_label;
      psVar14 = sljit_emit_jump(psVar17,0x18);
      ppjVar27 = local_f0;
      if (psVar21 != (sljit_label *)0x0) {
        sljit_set_label(psVar14,common->accept_label);
        goto LAB_001395ce;
      }
    }
    else {
      if (sVar8 != 0x9f) {
LAB_00138765:
        if ((sVar8 != 0xa1) && (common->currententry == (recurse_entry *)0x0)) goto LAB_00138775;
        goto LAB_001387bd;
      }
LAB_001378ce:
      psVar14 = sljit_emit_jump(psVar17,0x18);
      ppjVar27 = &pbVar24->topbacktracks;
    }
    add_jump(psVar17,ppjVar27,psVar14);
LAB_001395ce:
    psVar17 = (sljit_compiler *)((long)&((sljit_compiler *)cc)->error + 2);
    break;
  case 0xa2:
    if (common->currententry == (recurse_entry *)0x0) {
      psVar17 = common->compiler;
      uVar31 = *(ushort *)((long)&((sljit_compiler *)cc)->error + 2);
      sVar2 = common->optimized_cbracket[uVar31];
      if (sVar2 == '\0') {
        sljit_emit_op1(psVar17,0x20,1,0,0x8e,(long)common->cbra_ptr + (ulong)uVar31 * 8);
      }
      sljit_emit_op1(psVar17,0x20,0x8e,(long)common->ovector_start + (ulong)uVar31 * 0x10 + 8,2,0);
      if (sVar2 == '\0') {
        sljit_emit_op1(psVar17,0x20,0x8e,(ulong)uVar31 * 0x10 + (long)common->ovector_start,1,0);
      }
    }
    psVar17 = (sljit_compiler *)&((sljit_compiler *)cc)->options;
    break;
  case 0xa3:
    psVar17 = (sljit_compiler *)bracketend((PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + 2))
    ;
  }
switchD_001376e0_caseD_2:
  cc = (PCRE2_SPTR16)psVar17;
  if (psVar17 == (sljit_compiler *)0x0) {
switchD_0013758c_caseD_62:
    return;
  }
  goto LAB_00137559;
switchD_0013758c_caseD_7e:
  backtrack = (assert_backtrack *)sljit_alloc_memory(compiler,0x40);
  if (compiler->error != 0) {
    return;
  }
  backtrack->framesize = 0;
  backtrack->private_data_ptr = 0;
  backtrack->matchingpath = (sljit_label *)0x0;
  (backtrack->common).cc = (PCRE2_SPTR16)0x0;
  backtrack->condfailed = (jump_list *)0x0;
  (backtrack->common).top = (backtrack_common *)0x0;
  (backtrack->common).topbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = (backtrack_common *)0x0;
  (backtrack->common).nextbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = parent->top;
  (backtrack->common).cc = cc;
  parent->top = (backtrack_common *)backtrack;
  psVar17 = (sljit_compiler *)compile_assert_matchingpath(common,cc,backtrack,0);
  goto switchD_001376e0_caseD_2;
switchD_0013758c_caseD_6:
  ppjVar27 = &parent->top->nextbacktracks;
  if (parent->top == (backtrack_common *)0x0) {
    ppjVar27 = ppjVar13;
  }
LAB_00137a76:
  psVar17 = (sljit_compiler *)
            compile_char1_matchingpath
                      (common,uVar31,(PCRE2_SPTR16)((long)&((sljit_compiler *)cc)->error + 2),
                       ppjVar27,1);
  goto switchD_001376e0_caseD_2;
switchD_001375e4_caseD_17:
  psVar14 = sljit_emit_cmp(psVar29,3,2,0,0xd,0);
  if (common->nltype == 0) {
    if (common->newline < 0x100) {
      sljit_emit_op2(psVar29,0x60,4,0,2,0,0x40,2);
      sVar11 = 1;
      sljit_emit_op1(psVar29,0x23,1,0,0x82,0);
      psVar20 = sljit_emit_cmp(psVar29,1,4,0,0xd,0);
      add_jump(psVar29,ppjVar27,psVar20);
      uVar35 = (ulong)common->newline;
    }
    else {
      sljit_emit_op2(psVar29,0x60,4,0,2,0,0x40,4);
      sVar11 = 1;
      sljit_emit_op1(psVar29,0x23,1,0,0x82,0);
      if (common->mode == 1) {
        psVar20 = sljit_emit_cmp(psVar29,1,4,0,0xd,0);
        add_jump(psVar29,ppjVar27,psVar20);
      }
      else {
        psVar20 = sljit_emit_cmp(psVar29,0,4,0,0xd,0);
        sVar34 = 4;
        sljit_emit_op2(psVar29,0x862,0,0,4,0,0xd,0);
        sljit_emit_op_flags(psVar29,0x20,4,2,sVar34);
        sljit_emit_op2(psVar29,0x262,0,0,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
        sljit_emit_op_flags(psVar29,0x266,4,1,sVar11);
        psVar18 = sljit_emit_jump(psVar29,1);
        add_jump(psVar29,ppjVar27,psVar18);
        check_partial(common,1);
        psVar18 = sljit_emit_jump(psVar29,0x18);
        add_jump(psVar29,ppjVar27,psVar18);
        psVar21 = sljit_emit_label(psVar29);
        sljit_set_label(psVar20,psVar21);
      }
      sljit_emit_op1(psVar29,0x23,4,0,0x82,2);
      psVar20 = sljit_emit_cmp(psVar29,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
      add_jump(psVar29,ppjVar27,psVar20);
      uVar35 = (ulong)(byte)common->newline;
      sVar11 = 4;
    }
    psVar20 = sljit_emit_cmp(psVar29,1,sVar11,0,0x40,uVar35);
    add_jump(psVar29,ppjVar27,psVar20);
  }
  else {
    sljit_emit_op1(psVar29,0x23,1,0,0x82,0);
    psVar20 = sljit_emit_cmp(psVar29,1,1,0,0x40,0xd);
    sljit_emit_op2(psVar29,0x60,4,0,2,0,0x40,4);
    sljit_emit_op2(psVar29,0x1262,0,0,4,0,0xd,0);
    psVar18 = sljit_emit_jump(psVar29,4);
    psVar19 = sljit_emit_jump(psVar29,1);
    add_jump(psVar29,ppjVar27,psVar19);
    sljit_emit_op1(psVar29,0x23,1,0,0x82,2);
    psVar19 = sljit_emit_cmp(psVar29,0,1,0,0x40,10);
    jump = sljit_emit_jump(psVar29,0x18);
    add_jump(psVar29,ppjVar27,jump);
    psVar21 = sljit_emit_label(psVar29);
    sljit_set_label(psVar20,psVar21);
    if (common->nltype == 2) {
      sljit_emit_op2(psVar29,0x60,4,0,2,0,0x40,2);
      psVar20 = sljit_emit_cmp(psVar29,2,4,0,0xd,0);
      add_jump(psVar29,ppjVar27,psVar20);
      psVar20 = sljit_emit_cmp(psVar29,1,1,0,0x40,10);
      add_jump(psVar29,ppjVar27,psVar20);
    }
    else {
      BVar25 = 8;
      sVar32 = 0x20;
      sljit_emit_op1(psVar29,0x20,0x8e,8,2,0);
      read_char_range(common,sVar32,max_00,BVar25);
      psVar20 = sljit_emit_cmp(psVar29,1,2,0,0xd,0);
      add_jump(psVar29,ppjVar27,psVar20);
      psVar20 = sljit_emit_jump(psVar29,0x19);
      add_jump(psVar29,local_58,psVar20);
      psVar20 = sljit_emit_jump(psVar29,0);
      add_jump(psVar29,ppjVar27,psVar20);
      sljit_emit_op1(psVar29,0x20,2,0,0x8e,8);
    }
    psVar21 = sljit_emit_label(psVar29);
    sljit_set_label(psVar18,psVar21);
    psVar21 = sljit_emit_label(psVar29);
    sljit_set_label(psVar19,psVar21);
  }
  psVar21 = sljit_emit_label(psVar29);
  sljit_set_label(psVar14,psVar21);
LAB_00139baf:
  check_partial(common,0);
LAB_00139bb6:
  if (bVar38) {
    psVar17 = local_150;
  }
  goto switchD_001376e0_caseD_2;
}

Assistant:

static void compile_matchingpath(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, backtrack_common *parent)
{
DEFINE_COMPILER;
backtrack_common *backtrack;
BOOL has_then_trap = FALSE;
then_trap_backtrack *save_then_trap = NULL;

SLJIT_ASSERT(*ccend == OP_END || (*ccend >= OP_ALT && *ccend <= OP_KETRPOS));

if (common->has_then && common->then_offsets[cc - common->start] != 0)
  {
  SLJIT_ASSERT(*ccend != OP_END && common->control_head_ptr != 0);
  has_then_trap = TRUE;
  save_then_trap = common->then_trap;
  /* Tail item on backtrack. */
  compile_then_trap_matchingpath(common, cc, ccend, parent);
  }

while (cc < ccend)
  {
  switch(*cc)
    {
    case OP_SOD:
    case OP_SOM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_EODN:
    case OP_EOD:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_REVERSE:
    cc = compile_simple_assertion_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    break;

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_ANYBYTE:
    case OP_NOTPROP:
    case OP_PROP:
    case OP_ANYNL:
    case OP_NOT_HSPACE:
    case OP_HSPACE:
    case OP_NOT_VSPACE:
    case OP_VSPACE:
    case OP_EXTUNI:
    case OP_NOT:
    case OP_NOTI:
    cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_SET_SOM:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP2, 0);
    cc++;
    break;

    case OP_CHAR:
    case OP_CHARI:
    if (common->mode == PCRE2_JIT_COMPLETE)
      cc = compile_charn_matchingpath(common, cc, ccend, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    cc = compile_iterator_matchingpath(common, cc, parent);
    break;

    case OP_CLASS:
    case OP_NCLASS:
    if (cc[1 + (32 / sizeof(PCRE2_UCHAR))] >= OP_CRSTAR && cc[1 + (32 / sizeof(PCRE2_UCHAR))] <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
    case OP_XCLASS:
    if (*(cc + GET(cc, 1)) >= OP_CRSTAR && *(cc + GET(cc, 1)) <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;
#endif

    case OP_REF:
    case OP_REFI:
    if (cc[1 + IMM2_SIZE] >= OP_CRSTAR && cc[1 + IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + IMM2_SIZE;
      }
    break;

    case OP_DNREF:
    case OP_DNREFI:
    if (cc[1 + 2 * IMM2_SIZE] >= OP_CRSTAR && cc[1 + 2 * IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_dnref_search(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + 2 * IMM2_SIZE;
      }
    break;

    case OP_RECURSE:
    cc = compile_recurse_matchingpath(common, cc, parent);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    cc = compile_callout_matchingpath(common, cc, parent);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
    cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
    break;

    case OP_BRAMINZERO:
    PUSH_BACKTRACK_NOVALUE(sizeof(braminzero_backtrack), cc);
    cc = bracketend(cc + 1);
    if (*(cc - 1 - LINK_SIZE) != OP_KETRMIN)
      {
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      }
    else
      {
      allocate_stack(common, 2);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), STR_PTR, 0);
      }
    BACKTRACK_AS(braminzero_backtrack)->matchingpath = LABEL();
    count_match(common);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    cc = compile_bracket_matchingpath(common, cc, parent);
    break;

    case OP_BRAZERO:
    if (cc[1] > OP_ASSERTBACK_NOT)
      cc = compile_bracket_matchingpath(common, cc, parent);
    else
      {
      PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
      cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
      }
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    cc = compile_bracketpos_matchingpath(common, cc, parent);
    break;

    case OP_MARK:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    SLJIT_ASSERT(common->mark_ptr != 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
    allocate_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, TMP1, 0, ARGUMENTS, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0), TMP2, 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, (sljit_sw)(cc + 2));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP2, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(TMP1), SLJIT_OFFSETOF(jit_arguments, mark_ptr), TMP2, 0);
    if (common->has_skip_arg)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, STACK_TOP, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, type_mark);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), SLJIT_IMM, (sljit_sw)(cc + 2));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(3), STR_PTR, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP1, 0);
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    case OP_THEN:
    case OP_THEN_ARG:
    case OP_COMMIT:
    case OP_COMMIT_ARG:
    cc = compile_control_verb_matchingpath(common, cc, parent);
    break;

    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    cc = compile_fail_accept_matchingpath(common, cc, parent);
    break;

    case OP_CLOSE:
    cc = compile_close_matchingpath(common, cc);
    break;

    case OP_SKIPZERO:
    cc = bracketend(cc + 1);
    break;

    default:
    SLJIT_UNREACHABLE();
    return;
    }
  if (cc == NULL)
    return;
  }

if (has_then_trap)
  {
  /* Head item on backtrack. */
  PUSH_BACKTRACK_NOVALUE(sizeof(then_trap_backtrack), cc);
  BACKTRACK_AS(then_trap_backtrack)->common.cc = then_trap_opcode;
  BACKTRACK_AS(then_trap_backtrack)->then_trap = common->then_trap;
  common->then_trap = save_then_trap;
  }
SLJIT_ASSERT(cc == ccend);
}